

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

void __thiscall CTcGramProdTok::set_match_part_list(CTcGramProdTok *this)

{
  tctarg_prop_id_t *ptVar1;
  
  this->typ_ = TCGRAM_PART_OF_SPEECH_LIST;
  (this->val_).str_.len_ = 0;
  (this->val_).enum_id_ = 10;
  ptVar1 = (tctarg_prop_id_t *)CTcPrsMem::alloc(G_prsmem,0x14);
  (this->val_).prop_list_.arr_ = ptVar1;
  return;
}

Assistant:

void CTcGramProdTok::set_match_part_list()
{
    const size_t init_alo = 10;

    /* remember the type */
    typ_ = TCGRAM_PART_OF_SPEECH_LIST;

    /* we have nothing in the list yet */
    val_.prop_list_.len_ = 0;

    /* set the initial allocation size */
    val_.prop_list_.alo_ = init_alo;

    /* allocate the initial list */
    val_.prop_list_.arr_ = (tctarg_prop_id_t *)G_prsmem->alloc(
        init_alo * sizeof(val_.prop_list_.arr_[0]));
}